

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O1

char * makeplural(char *oldstr)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  boolean bVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  void *pvVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *__dest;
  char *pcVar12;
  
  iVar5 = nextobuf_bufidx + 1 >> 0x1f;
  nextobuf_bufidx =
       nextobuf_bufidx + (((uint)((nextobuf_bufidx + 1) / 6 + iVar5) >> 1) - iVar5) * -0xc + 1;
  __dest = nextobuf_bufs + (long)nextobuf_bufidx * 0x100;
  for (; *oldstr == ' '; oldstr = oldstr + 1) {
  }
  if (*oldstr == '\0') {
    warning("plural of null?");
    __dest[0] = 's';
    __dest[1] = '\0';
    return __dest;
  }
  strcpy(__dest,oldstr);
  iVar5 = strncmp(__dest,"pair of ",8);
  if (iVar5 == 0) {
    pcVar11 = (char *)0x0;
    goto LAB_0020260e;
  }
  pcVar10 = __dest;
  if (*__dest != '\0') {
    iVar5 = 0;
    pcVar12 = __dest;
    do {
      iVar6 = strncmp(pcVar12," of ",4);
      if (((((((iVar6 == 0) || (iVar6 = strncmp(pcVar12," [of ",5), iVar6 == 0)) ||
             (iVar6 = strncmp(pcVar12," labeled ",9), iVar6 == 0)) ||
            ((iVar6 = strncmp(pcVar12," called ",8), iVar6 == 0 ||
             (iVar6 = strncmp(pcVar12," named ",7), iVar6 == 0)))) ||
           ((iVar6 = strcmp(pcVar12," above"), iVar6 == 0 ||
            ((iVar6 = strncmp(pcVar12," versus ",8), iVar6 == 0 ||
             (iVar6 = strncmp(pcVar12," from ",6), iVar6 == 0)))))) ||
          (iVar6 = strncmp(pcVar12," in ",4), iVar6 == 0)) ||
         ((((iVar6 = strncmp(pcVar12,"-in-",4), iVar6 == 0 ||
            (iVar6 = strncmp(pcVar12," on ",4), iVar6 == 0)) ||
           (iVar6 = strncmp(pcVar12," a la ",6), iVar6 == 0)) ||
          (((iVar6 = strncmp(pcVar12," with",5), iVar6 == 0 ||
            (iVar6 = strncmp(pcVar12," de ",4), iVar6 == 0)) ||
           ((iVar6 = strncmp(pcVar12," d\'",3), iVar6 == 0 ||
            (iVar6 = strncmp(pcVar12," du ",4), iVar6 == 0)))))))) {
        pcVar11 = oldstr + iVar5;
        *pcVar12 = '\0';
        goto LAB_00202355;
      }
      pcVar10 = pcVar12 + 1;
      iVar5 = iVar5 + 1;
      pcVar11 = pcVar12 + 1;
      pcVar12 = pcVar10;
    } while (*pcVar11 != '\0');
  }
  pcVar11 = (char *)0x0;
  pcVar12 = pcVar10;
LAB_00202355:
  do {
    pcVar10 = pcVar12;
    cVar2 = pcVar10[-1];
    pcVar12 = pcVar10 + -1;
  } while (cVar2 == ' ');
  *pcVar10 = '\0';
  sVar7 = strlen(__dest);
  iVar5 = (int)sVar7;
  if ((iVar5 == 1) || (bVar4 = letter(cVar2), bVar4 == '\0')) {
    pcVar10[2] = '\0';
    pcVar10[0] = '\'';
    pcVar10[1] = 's';
    goto LAB_0020260e;
  }
  if ((((iVar5 == 2) && (iVar6 = strcmp(__dest,"ya"), iVar6 == 0)) ||
      ((1 < iVar5 && (iVar6 = strcmp(pcVar10 + -2,"ai"), iVar6 == 0)))) ||
     ((2 < iVar5 && (iVar6 = strcmp(pcVar10 + -3," ya"), iVar6 == 0)))) goto LAB_0020260e;
  if (3 < iVar5) {
    pcVar1 = pcVar10 + -4;
    iVar6 = strcmp(pcVar1,"fish");
    if ((((iVar6 == 0) || (iVar6 = strcmp(pcVar1,"tuna"), iVar6 == 0)) ||
        (iVar6 = strcmp(pcVar1,"deer"), iVar6 == 0)) || (iVar6 = strcmp(pcVar1,"yaki"), iVar6 == 0))
    goto LAB_0020260e;
  }
  if (4 < iVar5) {
    pcVar1 = pcVar10 + -5;
    iVar6 = strcmp(pcVar1,"sheep");
    if ((((iVar6 == 0) || (iVar6 = strcmp(pcVar1,"ninja"), iVar6 == 0)) ||
        ((iVar6 = strcmp(pcVar1,"ronin"), iVar6 == 0 ||
         ((iVar6 = strcmp(pcVar1,"shito"), iVar6 == 0 ||
          (iVar6 = strcmp(pcVar10 + -8,"shuriken"), iVar6 == 0)))))) ||
       ((iVar6 = strcmp(pcVar1,"tengu"), iVar6 == 0 || (iVar6 = strcmp(pcVar1,"manes"), iVar6 == 0))
       )) goto LAB_0020260e;
  }
  if (5 < iVar5) {
    iVar6 = strcmp(pcVar10 + -6,"ki-rin");
    if ((iVar6 == 0) || (iVar6 = strcmp(pcVar10 + -6,"Nazgul"), iVar6 == 0)) goto LAB_0020260e;
  }
  if ((6 < iVar5) && (iVar6 = strcmp(pcVar10 + -7,"gunyoki"), iVar6 == 0)) goto LAB_0020260e;
  if ((((iVar5 < 3) || (iVar6 = strcmp(pcVar10 + -3,"man"), iVar6 != 0)) ||
      ((5 < iVar5 && (iVar6 = strcmp(pcVar10 + -6,"shaman"), iVar6 == 0)))) ||
     ((4 < iVar5 && (iVar6 = strcmp(pcVar10 + -5,"human"), iVar6 == 0)))) {
    if ((4 < iVar5) && (iVar6 = strcmp(pcVar10 + -5,"tooth"), iVar6 == 0)) {
      builtin_strncpy(pcVar10 + -4,"eeth",5);
      goto LAB_0020260e;
    }
    pcVar1 = pcVar10 + -2;
    iVar6 = strcmp(pcVar1,"fe");
    if (iVar6 == 0) {
LAB_002028d2:
      builtin_strncpy(pcVar10 + -2,"ves",4);
      goto LAB_0020260e;
    }
    cVar2 = *pcVar12;
    if (cVar2 == 0x66) {
      cVar3 = pcVar10[-2];
      pvVar8 = memchr("lr",(int)cVar3,3);
      if ((pvVar8 != (void *)0x0) ||
         (pcVar9 = strchr("aeiouAEIOU",(int)cVar3), pcVar9 != (char *)0x0)) {
        builtin_strncpy(pcVar10 + -1,"ves",4);
        goto LAB_0020260e;
      }
      if ((4 < iVar5) && (iVar6 = strncmp(pcVar10 + -5,"staf",4), iVar6 == 0)) goto LAB_002028d2;
    }
    if ((3 < iVar5) && (iVar6 = strcmp(pcVar10 + -4,"foot"), iVar6 == 0)) {
      builtin_strncpy(pcVar10 + -3,"eet",4);
      goto LAB_0020260e;
    }
    if ((2 < iVar5) && (iVar6 = strcmp(pcVar10 + -3,"ium"), iVar6 == 0)) {
      pcVar10[-2] = 'a';
      pcVar10[-1] = '\0';
      goto LAB_0020260e;
    }
    if ((3 < iVar5) && (iVar6 = strcmp(pcVar10 + -4,"alga"), iVar6 == 0)) {
LAB_002028df:
      pcVar10[1] = '\0';
      pcVar12[0] = 'a';
      pcVar12[1] = 'e';
      goto LAB_0020260e;
    }
    if (4 < iVar5) {
      iVar6 = strcmp(pcVar10 + -5,"hypha");
      if ((iVar6 == 0) || (iVar6 = strcmp(pcVar10 + -5,"larva"), iVar6 == 0)) goto LAB_002028df;
    }
    if (((3 < iVar5) && (iVar6 = strcmp(pcVar1,"us"), iVar6 == 0)) &&
       ((iVar5 == 4 ||
        ((iVar6 = strcmp(pcVar10 + -5,"lotus"), iVar6 != 0 &&
         ((iVar5 < 6 || (iVar6 = strcmp(pcVar10 + -6,"wumpus"), iVar6 != 0)))))))) {
      pcVar10[-2] = 'i';
      pcVar10[-1] = '\0';
      goto LAB_0020260e;
    }
    if (5 < iVar5) {
      iVar6 = strcmp(pcVar10 + -4,"rtex");
      if (iVar6 == 0) {
        builtin_strncpy(pcVar10 + -2,"ices",5);
        goto LAB_0020260e;
      }
      iVar6 = strcmp(pcVar10 + -6,"djinni");
      if (iVar6 == 0) {
        *pcVar12 = '\0';
        goto LAB_0020260e;
      }
    }
    if ((4 < iVar5) && (iVar6 = strcmp(pcVar10 + -5,"mumak"), iVar6 == 0)) {
      pcVar10[2] = '\0';
      pcVar10[0] = 'i';
      pcVar10[1] = 'l';
      goto LAB_0020260e;
    }
    if ((iVar5 < 3) || (iVar6 = strcmp(pcVar10 + -3,"sis"), iVar6 != 0)) {
      if ((iVar5 < 6) || (iVar6 = strcmp(pcVar10 + -6,"erinys"), iVar6 != 0)) {
        if ((iVar5 < 5) ||
           ((iVar6 = strcmp(pcVar10 + -4,"ouse"), iVar6 != 0 ||
            (pvVar8 = memchr("MmLl",(int)pcVar10[-5],5), pvVar8 == (void *)0x0)))) {
          if (5 < iVar5) {
            iVar6 = strcmp(pcVar10 + -6,"matzoh");
            if ((iVar6 == 0) || (iVar6 = strcmp(pcVar10 + -6,"matzah"), iVar6 == 0)) {
              *pcVar10 = '\0';
              pcVar1[0] = 'o';
              pcVar1[1] = 't';
              goto LAB_0020260e;
            }
          }
          if (4 < iVar5) {
            iVar6 = strcmp(pcVar10 + -5,"matzo");
            if ((iVar6 == 0) || (iVar6 = strcmp(pcVar10 + -6,"matza"), iVar6 == 0)) {
              pcVar10[1] = '\0';
              pcVar12[0] = 'o';
              pcVar12[1] = 't';
              goto LAB_0020260e;
            }
            iVar6 = strcmp(pcVar10 + -5,"child");
            if (iVar6 == 0) {
              builtin_strncpy(pcVar10 + -1,"dren",5);
              goto LAB_0020260e;
            }
          }
          pvVar8 = memchr("zxs",(int)cVar2,4);
          if ((pvVar8 == (void *)0x0) &&
             ((((iVar5 < 2 || (cVar2 != 'h')) ||
               (pvVar8 = memchr("cs",(int)pcVar10[-2],3), pvVar8 == (void *)0x0)) &&
              ((iVar5 < 4 || (iVar5 = strcmp(pcVar10 + -3,"ato"), iVar5 != 0)))))) {
            if ((cVar2 == 'y') &&
               (pcVar12 = strchr("aeiouAEIOU",(int)pcVar10[-2]), pcVar12 == (char *)0x0)) {
              builtin_strncpy(pcVar10 + -1,"ies",4);
            }
            else {
              pcVar10[0] = 's';
              pcVar10[1] = '\0';
            }
          }
          else {
            pcVar10[2] = '\0';
            pcVar10[0] = 'e';
            pcVar10[1] = 's';
          }
        }
        else {
          builtin_strncpy(pcVar10 + -4,"ice",4);
        }
      }
      else {
        pcVar10[1] = '\0';
        pcVar12[0] = 'e';
        pcVar12[1] = 's';
      }
      goto LAB_0020260e;
    }
  }
  pcVar10[-2] = 'e';
LAB_0020260e:
  if (pcVar11 != (char *)0x0) {
    pcVar10 = eos(__dest);
    strcpy(pcVar10,pcVar11);
  }
  return __dest;
}

Assistant:

char *makeplural(const char *oldstr)
{
	/* Note: cannot use strcmpi here -- it'd give MATZot, CAVEMeN,... */
	char *spot;
	char *str = nextobuf();
	const char *excess = NULL;
	int len;

	while (*oldstr==' ') oldstr++;
	if (!*oldstr) {
		warning("plural of null?");
		strcpy(str, "s");
		return str;
	}
	strcpy(str, oldstr);

	/*
	 * Skip changing "pair of" to "pairs of".  According to Webster, usual
	 * English usage is use pairs for humans, e.g. 3 pairs of dancers,
	 * and pair for objects and non-humans, e.g. 3 pair of boots.  We don't
	 * refer to pairs of humans in this game so just skip to the bottom.
	 */
	if (!strncmp(str, "pair of ", 8))
		goto bottom;

	/* Search for common compounds, ex. lump of royal jelly */
	for (spot=str; *spot; spot++) {
		if (!strncmp(spot, " of ", 4)
				/* DYWYPISI: pluralize "dart [of fire]" */
				|| !strncmp(spot, " [of ", 5)
				|| !strncmp(spot, " labeled ", 9)
				|| !strncmp(spot, " called ", 8)
				|| !strncmp(spot, " named ", 7)
				|| !strcmp(spot, " above") /* lurkers above */
				|| !strncmp(spot, " versus ", 8)
				|| !strncmp(spot, " from ", 6)
				|| !strncmp(spot, " in ", 4)
				|| !strncmp(spot, "-in-", 4) /* mother-in-law */
				|| !strncmp(spot, " on ", 4)
				|| !strncmp(spot, " a la ", 6)
				|| !strncmp(spot, " with", 5)	/* " with "? */
				|| !strncmp(spot, " de ", 4)
				|| !strncmp(spot, " d'", 3)
				|| !strncmp(spot, " du ", 4)) {
			excess = oldstr + (int) (spot - str);
			*spot = 0;
			break;
		}
	}
	spot--;
	while (*spot==' ') spot--; /* Strip blanks from end */
	*(spot+1) = 0;
	/* Now spot is the last character of the string */

	len = strlen(str);

	/* Single letters */
	if (len==1 || !letter(*spot)) {
		strcpy(spot+1, "'s");
		goto bottom;
	}

	/* Same singular and plural; mostly Japanese words except for "manes" */
	if ((len == 2 && !strcmp(str, "ya")) ||
	    (len >= 2 && !strcmp(spot-1, "ai")) || /* samurai, Uruk-hai */
	    (len >= 3 && !strcmp(spot-2, " ya")) ||
	    (len >= 4 &&
	     (!strcmp(spot-3, "fish") || !strcmp(spot-3, "tuna") ||
	      !strcmp(spot-3, "deer") || !strcmp(spot-3, "yaki"))) ||
	    (len >= 5 && (!strcmp(spot-4, "sheep") ||
			!strcmp(spot-4, "ninja") ||
			!strcmp(spot-4, "ronin") ||
			!strcmp(spot-4, "shito") ||
			!strcmp(spot-7, "shuriken") ||
			!strcmp(spot-4, "tengu") ||
			!strcmp(spot-4, "manes"))) ||
	    (len >= 6 && !strcmp(spot-5, "ki-rin")) ||
	    (len >= 6 && !strcmp(spot-5, "Nazgul")) ||
	    (len >= 7 && !strcmp(spot-6, "gunyoki")))
		goto bottom;

	/* man/men ("Wiped out all cavemen.") */
	if (len >= 3 && !strcmp(spot-2, "man") &&
			(len<6 || strcmp(spot-5, "shaman")) &&
			(len<5 || strcmp(spot-4, "human"))) {
		*(spot-1) = 'e';
		goto bottom;
	}

	/* tooth/teeth */
	if (len >= 5 && !strcmp(spot-4, "tooth")) {
		strcpy(spot-3, "eeth");
		goto bottom;
	}

	/* knife/knives, etc... */
	if (!strcmp(spot-1, "fe")) {
		strcpy(spot-1, "ves");
		goto bottom;
	} else if (*spot == 'f') {
		if (strchr("lr", *(spot-1)) || strchr(vowels, *(spot-1))) {
			strcpy(spot, "ves");
			goto bottom;
		} else if (len >= 5 && !strncmp(spot-4, "staf", 4)) {
			strcpy(spot-1, "ves");
			goto bottom;
		}
	}

	/* foot/feet (body part) */
	if (len >= 4 && !strcmp(spot-3, "foot")) {
		strcpy(spot-2, "eet");
		goto bottom;
	}

	/* ium/ia (mycelia, baluchitheria) */
	if (len >= 3 && !strcmp(spot-2, "ium")) {
		*(spot--) = (char)0;
		*spot = 'a';
		goto bottom;
	}

	/* algae, larvae, hyphae (another fungus part) */
	if ((len >= 4 && !strcmp(spot-3, "alga")) ||
	    (len >= 5 &&
	     (!strcmp(spot-4, "hypha") || !strcmp(spot-4, "larva")))) {
		strcpy(spot, "ae");
		goto bottom;
	}

	/* fungus/fungi, homunculus/homunculi, but buses, lotuses, wumpuses */
	if (len > 3 && !strcmp(spot-1, "us") &&
	    (len < 5 || (strcmp(spot-4, "lotus") &&
			 (len < 6 || strcmp(spot-5, "wumpus"))))) {
		*(spot--) = (char)0;
		*spot = 'i';
		goto bottom;
	}

	/* vortex/vortices */
	if (len >= 6 && !strcmp(spot-3, "rtex")) {
		strcpy(spot-1, "ices");
		goto bottom;
	}

	/* djinni/djinn (note: also efreeti/efreet) */
	if (len >= 6 && !strcmp(spot-5, "djinni")) {
		*spot = (char)0;
		goto bottom;
	}

	/* mumak/mumakil */
	if (len >= 5 && !strcmp(spot-4, "mumak")) {
		strcpy(spot+1, "il");
		goto bottom;
	}

	/* sis/ses (nemesis) */
	if (len >= 3 && !strcmp(spot-2, "sis")) {
		*(spot-1) = 'e';
		goto bottom;
	}

	/* erinys/erinyes */
	if (len >= 6 && !strcmp(spot-5, "erinys")) {
		strcpy(spot, "es");
		goto bottom;
	}

	/* mouse/mice,louse/lice (not a monster, but possible in food names) */
	if (len >= 5 && !strcmp(spot-3, "ouse") && strchr("MmLl", *(spot-4))) {
		strcpy(spot-3, "ice");
		goto bottom;
	}

	/* matzoh/matzot, possible food name */
	if (len >= 6 && (!strcmp(spot-5, "matzoh")
					|| !strcmp(spot-5, "matzah"))) {
		strcpy(spot-1, "ot");
		goto bottom;
	}
	if (len >= 5 && (!strcmp(spot-4, "matzo")
					|| !strcmp(spot-5, "matza"))) {
		strcpy(spot, "ot");
		goto bottom;
	}

	/* child/children (for wise guys who give their food funny names) */
	if (len >= 5 && !strcmp(spot-4, "child")) {
		strcpy(spot, "dren");
		goto bottom;
	}

	/* note: -eau/-eaux (gateau, bordeau...) */
	/* note: ox/oxen, VAX/VAXen, goose/geese */

	/* Ends in z, x, s, ch, sh; add an "es" */
	if (strchr("zxs", *spot)
			|| (len >= 2 && *spot=='h' && strchr("cs", *(spot-1)))
	/* Kludge to get "tomatoes" and "potatoes" right */
			|| (len >= 4 && !strcmp(spot-2, "ato"))) {
		strcpy(spot+1, "es");
		goto bottom;
	}

	/* Ends in y preceded by consonant (note: also "qu") change to "ies" */
	if (*spot == 'y' &&
	    (!strchr(vowels, *(spot-1)))) {
		strcpy(spot, "ies");
		goto bottom;
	}

	/* Default: append an 's' */
	strcpy(spot+1, "s");

bottom:	if (excess) strcpy(eos(str), excess);
	return str;
}